

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_status64(int op,sqlite3_int64 *pCurrent,sqlite3_int64 *pHighwater,int resetFlag)

{
  sqlite3_mutex *psVar1;
  sqlite3StatValueType sVar2;
  Mem0Global *pMVar3;
  int iVar4;
  
  if ((uint)op < 10) {
    pMVar3 = &mem0;
    if ((0x379UL >> ((ulong)(uint)op & 0x3f) & 1) == 0) {
      pMVar3 = (Mem0Global *)&pcache1_g.mutex;
    }
    psVar1 = pMVar3->mutex;
    if (psVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar1);
    }
    sVar2 = sqlite3Stat.nowValue[(uint)op];
    *pCurrent = sVar2;
    *pHighwater = sqlite3Stat.mxValue[(uint)op];
    if (resetFlag != 0) {
      sqlite3Stat.mxValue[(uint)op] = sVar2;
    }
    iVar4 = 0;
    if (psVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    }
  }
  else {
    iVar4 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x4f95,
                "fb90e7189ae6d62e77ba3a308ca5d683f90bbe633cf681865365b8e92792d1c7");
  }
  return iVar4;
}

Assistant:

SQLITE_API int sqlite3_status64(
  int op,
  sqlite3_int64 *pCurrent,
  sqlite3_int64 *pHighwater,
  int resetFlag
){
  sqlite3_mutex *pMutex;
  wsdStatInit;
  if( op<0 || op>=ArraySize(wsdStat.nowValue) ){
    return SQLITE_MISUSE_BKPT;
  }
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCurrent==0 || pHighwater==0 ) return SQLITE_MISUSE_BKPT;
#endif
  pMutex = statMutex[op] ? sqlite3Pcache1Mutex() : sqlite3MallocMutex();
  sqlite3_mutex_enter(pMutex);
  *pCurrent = wsdStat.nowValue[op];
  *pHighwater = wsdStat.mxValue[op];
  if( resetFlag ){
    wsdStat.mxValue[op] = wsdStat.nowValue[op];
  }
  sqlite3_mutex_leave(pMutex);
  (void)pMutex;  /* Prevent warning when SQLITE_THREADSAFE=0 */
  return SQLITE_OK;
}